

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expected.hpp
# Opt level: O2

type __thiscall
nonstd::expected_lite::expected<void,_char>::swap<char>
          (expected<void,_char> *this,expected<void,_char> *other)

{
  bool bVar1;
  anon_union_1_2_26c77401_for_storage_t_impl<void,_char>_2 aVar2;
  byte bVar3;
  error_type_conflict *peVar4;
  expected<void,_char> *peVar5;
  
  bVar3 = (this->contained).super_storage_t_impl<void,_char>.m_has_value;
  do {
    peVar5 = this;
    this = other;
    bVar1 = (this->contained).super_storage_t_impl<void,_char>.m_has_value;
    if ((bVar3 & 1) != 0) {
      if (bVar1 != false) {
        return;
      }
      peVar4 = error(this);
      (peVar5->contained).super_storage_t_impl<void,_char>.field_0.m_error = *peVar4;
      bVar1 = (this->contained).super_storage_t_impl<void,_char>.m_has_value;
      (this->contained).super_storage_t_impl<void,_char>.m_has_value =
           (peVar5->contained).super_storage_t_impl<void,_char>.m_has_value;
      (peVar5->contained).super_storage_t_impl<void,_char>.m_has_value = bVar1;
      return;
    }
    other = peVar5;
    bVar3 = bVar1;
  } while (bVar1 != false);
  aVar2 = (peVar5->contained).super_storage_t_impl<void,_char>.field_0;
  (peVar5->contained).super_storage_t_impl<void,_char>.field_0 =
       (this->contained).super_storage_t_impl<void,_char>.field_0;
  (this->contained).super_storage_t_impl<void,_char>.field_0 = aVar2;
  return;
}

Assistant:

swap( expected & other ) noexcept
    (
        std::is_nothrow_move_constructible<E>::value && std17::is_nothrow_swappable<E&>::value
    )
    {
        using std::swap;

        if      ( ! bool(*this) && ! bool(other) ) { swap( contained.error(), other.contained.error() ); }
        else if (   bool(*this) && ! bool(other) ) { contained.construct_error( std::move( other.error() ) );
                                                     bool has_value = contained.has_value();
                                                     bool other_has_value = other.has_value();
                                                     other.contained.set_has_value(has_value);
                                                     contained.set_has_value(other_has_value);
                                                     }
        else if ( ! bool(*this) &&   bool(other) ) { other.swap( *this ); }
    }